

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallNormalHeapBlock.cpp
# Opt level: O3

SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *
Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>::New
          (HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
           *bucket)

{
  undefined4 *puVar1;
  uint objectCount;
  code *pcVar2;
  bool bVar3;
  HeapAllocator *pHVar4;
  size_t sVar5;
  size_t sVar6;
  char *__s;
  uint uVar7;
  undefined8 *in_FS_OFFSET;
  undefined1 local_60 [8];
  TrackAllocData data;
  
  uVar7 = (bucket->super_HeapBucket).sizeCat;
  if (0x2000 < uVar7) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBlock.cpp"
                       ,0x1d,"(bucket->sizeCat <= TBlockAttributes::MaxObjectSize)",
                       "bucket->sizeCat <= TBlockAttributes::MaxObjectSize");
    if (!bVar3) goto LAB_0029f149;
    *puVar1 = 0;
    uVar7 = (bucket->super_HeapBucket).sizeCat;
  }
  objectCount = 0x8000 / (uVar7 & 0xffff);
  data._32_8_ = bucket;
  pHVar4 = HeapAllocator::GetNoMemProtectInstance();
  data.typeinfo =
       (type_info *)SmallHeapBlockT<MediumAllocationBlockAttributes>::GetAllocPlusSize(objectCount);
  local_60 = (undefined1  [8])&typeinfo;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_1a2dbe;
  data.filename._0_4_ = 0x24;
  pHVar4 = HeapAllocator::TrackAllocInfo(pHVar4,(TrackAllocData *)local_60);
  sVar5 = SmallHeapBlockT<MediumAllocationBlockAttributes>::GetAllocPlusSize(objectCount);
  if (sVar5 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                       ,0x240,"(plusSize != 0)","plusSize != 0");
    if (!bVar3) goto LAB_0029f149;
    *puVar1 = 0;
    sVar6 = 0;
  }
  else {
    sVar6 = sVar5 + 7 & 0xfffffffffffffff8;
  }
  if (sVar6 != sVar5) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                       ,0x243,"(plusSize == Math::Align<size_t>(plusSize, sizeof(size_t)))",
                       "plusSize == Math::Align<size_t>(plusSize, sizeof(size_t))");
    if (!bVar3) {
LAB_0029f149:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar1 = 0;
  }
  sVar6 = 0xffffffffffffffff;
  if (sVar5 < 0xfffffffffffffa90) {
    sVar6 = sVar5 + 0x570;
  }
  __s = HeapAllocator::AllocT<true>(pHVar4,sVar6);
  if (__s == (char *)0x0) {
    sVar5 = 0;
  }
  else {
    memset(__s,0,sVar6);
  }
  SmallNormalWithBarrierHeapBlockT
            ((SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)(__s + sVar5),
             (HeapBucket *)data._32_8_,(ushort)uVar7,(ushort)objectCount,
             MediumNormalBlockWithBarrierType);
  return (SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)(__s + sVar5);
}

Assistant:

SmallNormalWithBarrierHeapBlockT<TBlockAttributes> *
SmallNormalWithBarrierHeapBlockT<TBlockAttributes>::New(HeapBucketT<SmallNormalWithBarrierHeapBlockT<TBlockAttributes>> * bucket)
{
    CompileAssert(TBlockAttributes::MaxObjectSize <= USHRT_MAX);
    Assert(bucket->sizeCat <= TBlockAttributes::MaxObjectSize);
    Assert((TBlockAttributes::PageCount * AutoSystemInfo::PageSize) / bucket->sizeCat <= USHRT_MAX);

    ushort objectSize = (ushort)bucket->sizeCat;
    ushort objectCount = (ushort)((TBlockAttributes::PageCount * AutoSystemInfo::PageSize) / objectSize);

    HeapBlockType blockType = (TBlockAttributes::IsSmallBlock ? HeapBlock::SmallNormalBlockWithBarrierType : HeapBlock::MediumNormalBlockWithBarrierType);
    return NoMemProtectHeapNewNoThrowPlusPrefixZ(Base::GetAllocPlusSize(objectCount), SmallNormalWithBarrierHeapBlockT<TBlockAttributes>, bucket, objectSize, objectCount, blockType);
}